

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_points.cpp
# Opt level: O0

Am_Point_List * __thiscall
Am_Point_List::Append(Am_Point_List *this,Am_Point_List *other_list,bool unique)

{
  bool bVar1;
  Am_Point_List_Data *this_00;
  float local_34;
  float local_30;
  float y;
  float x;
  undefined1 local_19;
  Am_Point_List *pAStack_18;
  bool unique_local;
  Am_Point_List *other_list_local;
  Am_Point_List *this_local;
  
  local_19 = unique;
  pAStack_18 = other_list;
  other_list_local = this;
  if (this->data == (Am_Point_List_Data *)0x0) {
    this_00 = (Am_Point_List_Data *)operator_new(0x20);
    Am_Point_List_Data::Am_Point_List_Data(this_00);
    this->data = this_00;
  }
  else if (unique) {
    Am_Point_List_Data::Make_Unique(this->data,&this->data,&this->item);
  }
  Start(other_list);
  while (bVar1 = Last(other_list), ((bVar1 ^ 0xffU) & 1) != 0) {
    Get(other_list,&local_30,&local_34);
    Add(this,local_30,local_34,Am_TAIL,false);
    Next(other_list);
  }
  return this;
}

Assistant:

Am_Point_List &
Am_Point_List::Append(Am_Point_List other_list, bool unique)
{
  if (data) {
    if (unique)
      data->Make_Unique(data, item);
  } else
    data = new Am_Point_List_Data();

  float x, y;
  for (other_list.Start(); !other_list.Last(); other_list.Next()) {
    other_list.Get(x, y);
    Add(x, y, Am_TAIL, false); //only need to make me unique once
  }
  return *this;
}